

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Util::Permutation(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Util *this,size_t size)

{
  size_t i;
  size_t sVar1;
  int local_2c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,size);
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    local_2c = (int)sVar1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_2c);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,&this->rng_);
  return __return_storage_ptr__;
}

Assistant:

vector<int> Util::Permutation(size_t size) {
    vector<int> permutation;
    permutation.reserve(size);
    for (size_t i = 0; i < size; i++) permutation.push_back(i);
    shuffle(permutation.begin(), permutation.end(), rng_);
    return permutation;
}